

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PretransformVertices.cpp
# Opt level: O0

void __thiscall
Assimp::PretransformVertices::ApplyTransform
          (PretransformVertices *this,aiMesh *mesh,aiMatrix4x4 *mat)

{
  bool bVar1;
  aiVector3D *paVar2;
  aiMatrix3x3t<float> *paVar3;
  aiVector3t<float> *paVar4;
  float fVar5;
  aiVector3t<float> aVar6;
  aiVector3t<float> local_e8;
  aiVector3t<float> local_d4;
  aiVector3t<float> local_c8;
  aiVector3t<float> local_b8;
  uint local_ac;
  float fStack_a8;
  uint i_2;
  float local_a0;
  aiVector3t<float> local_98;
  uint local_8c;
  uint i_1;
  undefined1 local_64 [8];
  aiMatrix3x3 m;
  float local_38;
  uint local_24;
  uint i;
  aiMatrix4x4 *mat_local;
  aiMesh *mesh_local;
  PretransformVertices *this_local;
  
  bVar1 = aiMatrix4x4t<float>::IsIdentity(mat);
  if (!bVar1) {
    bVar1 = aiMesh::HasFaces(mesh);
    if ((bVar1) && (fVar5 = aiMatrix4x4t<float>::Determinant(mat), fVar5 < 0.0)) {
      FlipWindingOrderProcess::ProcessMesh(mesh);
    }
    bVar1 = aiMesh::HasPositions(mesh);
    if (bVar1) {
      for (local_24 = 0; local_24 < mesh->mNumVertices; local_24 = local_24 + 1) {
        aVar6 = ::operator*(mat,mesh->mVertices + local_24);
        m._28_8_ = aVar6._0_8_;
        local_38 = aVar6.z;
        paVar2 = mesh->mVertices + local_24;
        paVar2->x = m.c2;
        paVar2->y = m.c3;
        paVar2->z = local_38;
        unique0x1000035e = aVar6;
      }
    }
    bVar1 = aiMesh::HasNormals(mesh);
    if ((bVar1) || (bVar1 = aiMesh::HasTangentsAndBitangents(mesh), bVar1)) {
      aiMatrix3x3t<float>::aiMatrix3x3t((aiMatrix3x3t<float> *)&stack0xffffffffffffff78,mat);
      paVar3 = aiMatrix3x3t<float>::Inverse((aiMatrix3x3t<float> *)&stack0xffffffffffffff78);
      paVar3 = aiMatrix3x3t<float>::Transpose(paVar3);
      memcpy(local_64,paVar3,0x24);
      bVar1 = aiMesh::HasNormals(mesh);
      if (bVar1) {
        for (local_8c = 0; local_8c < mesh->mNumVertices; local_8c = local_8c + 1) {
          aVar6 = ::operator*((aiMatrix3x3t<float> *)local_64,mesh->mNormals + local_8c);
          _fStack_a8 = aVar6._0_8_;
          local_98.x = fStack_a8;
          local_98.y = (float)i_2;
          local_a0 = aVar6.z;
          local_98.z = local_a0;
          _fStack_a8 = aVar6;
          paVar4 = aiVector3t<float>::Normalize(&local_98);
          paVar2 = mesh->mNormals + local_8c;
          fVar5 = paVar4->y;
          paVar2->x = paVar4->x;
          paVar2->y = fVar5;
          paVar2->z = paVar4->z;
        }
      }
      bVar1 = aiMesh::HasTangentsAndBitangents(mesh);
      if (bVar1) {
        for (local_ac = 0; local_ac < mesh->mNumVertices; local_ac = local_ac + 1) {
          aVar6 = ::operator*((aiMatrix3x3t<float> *)local_64,mesh->mTangents + local_ac);
          local_c8.z = aVar6.z;
          local_b8.z = local_c8.z;
          local_c8._0_8_ = aVar6._0_8_;
          local_b8.x = local_c8.x;
          local_b8.y = local_c8.y;
          local_c8 = aVar6;
          paVar4 = aiVector3t<float>::Normalize(&local_b8);
          paVar2 = mesh->mTangents;
          paVar2[local_ac].z = paVar4->z;
          fVar5 = paVar4->y;
          paVar2 = paVar2 + local_ac;
          paVar2->x = paVar4->x;
          paVar2->y = fVar5;
          aVar6 = ::operator*((aiMatrix3x3t<float> *)local_64,mesh->mBitangents + local_ac);
          local_e8._0_8_ = aVar6._0_8_;
          local_d4.x = local_e8.x;
          local_d4.y = local_e8.y;
          local_e8.z = aVar6.z;
          local_d4.z = local_e8.z;
          paVar4 = aiVector3t<float>::Normalize(&local_d4);
          paVar2 = mesh->mBitangents + local_ac;
          fVar5 = paVar4->y;
          paVar2->x = paVar4->x;
          paVar2->y = fVar5;
          paVar2->z = paVar4->z;
        }
      }
    }
  }
  return;
}

Assistant:

void PretransformVertices::ApplyTransform(aiMesh *mesh, const aiMatrix4x4 &mat) const {
	// Check whether we need to transform the coordinates at all
	if (!mat.IsIdentity()) {

		// Check for odd negative scale (mirror)
		if (mesh->HasFaces() && mat.Determinant() < 0) {
			// Reverse the mesh face winding order
			FlipWindingOrderProcess::ProcessMesh(mesh);
		}

		// Update positions
		if (mesh->HasPositions()) {
			for (unsigned int i = 0; i < mesh->mNumVertices; ++i) {
				mesh->mVertices[i] = mat * mesh->mVertices[i];
			}
		}

		// Update normals and tangents
		if (mesh->HasNormals() || mesh->HasTangentsAndBitangents()) {
			const aiMatrix3x3 m = aiMatrix3x3(mat).Inverse().Transpose();

			if (mesh->HasNormals()) {
				for (unsigned int i = 0; i < mesh->mNumVertices; ++i) {
					mesh->mNormals[i] = (m * mesh->mNormals[i]).Normalize();
				}
			}
			if (mesh->HasTangentsAndBitangents()) {
				for (unsigned int i = 0; i < mesh->mNumVertices; ++i) {
					mesh->mTangents[i] = (m * mesh->mTangents[i]).Normalize();
					mesh->mBitangents[i] = (m * mesh->mBitangents[i]).Normalize();
				}
			}
		}
	}
}